

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::nmorer(Forth *this)

{
  uint x;
  uint x_00;
  ulong local_20;
  size_t i;
  uint index;
  Forth *this_local;
  
  requireDStackDepth(this,1,"N>R");
  x = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  requireDStackDepth(this,(ulong)x,"N>R");
  requireRStackAvailable(this,(ulong)(x + 1),">R");
  for (local_20 = 0; local_20 < x; local_20 = local_20 + 1) {
    x_00 = ForthStack<unsigned_int>::getTop(&this->dStack);
    rpush(this,x_00);
    pop(this);
  }
  rpush(this,x);
  return;
}

Assistant:

void nmorer() {
			REQUIRE_DSTACK_DEPTH(1, "N>R");
			auto index = dStack.getTop(); pop();
			REQUIRE_DSTACK_DEPTH(index, "N>R");
			REQUIRE_RSTACK_AVAILABLE(index+1, ">R");
			for(size_t i=0;i<index;++i){
			 rpush(dStack.getTop()); pop();
			}
			rpush(index);
		}